

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

optional<std::array<unsigned_int,_4UL>_> * __thiscall
tinyusdz::primvar::PrimVar::get_value<std::array<unsigned_int,4ul>>
          (optional<std::array<unsigned_int,_4UL>_> *__return_storage_ptr__,PrimVar *this)

{
  bool bVar1;
  optional<std::array<unsigned_int,_4UL>_> local_30;
  PrimVar *local_18;
  PrimVar *this_local;
  
  local_18 = this;
  this_local = (PrimVar *)__return_storage_ptr__;
  bVar1 = is_blocked(this);
  if (bVar1) {
    nonstd::optional_lite::optional<std::array<unsigned_int,_4UL>_>::optional
              (__return_storage_ptr__);
  }
  else {
    bVar1 = has_default(this);
    if (bVar1) {
      tinyusdz::value::Value::get_value<std::array<unsigned_int,4ul>>(&local_30,&this->_value,false)
      ;
      nonstd::optional_lite::optional<std::array<unsigned_int,_4UL>_>::
      optional<std::array<unsigned_int,_4UL>,_0>(__return_storage_ptr__,&local_30);
      nonstd::optional_lite::optional<std::array<unsigned_int,_4UL>_>::~optional(&local_30);
    }
    else {
      nonstd::optional_lite::optional<std::array<unsigned_int,_4UL>_>::optional
                (__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {

    if (is_blocked()) {
      return nonstd::nullopt;
    }

    if (!has_default()) {
      return nonstd::nullopt;
    }

    return _value.get_value<T>();
  }